

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::ReadLRFs(ParserProbModelXML *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  xmlNodeSetPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr node;
  unsigned_long uVar3;
  FactoredDecPOMDPDiscrete *this_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  xmlXPathObjectPtr pxVar8;
  xmlXPathObjectPtr pxVar9;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar10;
  xmlXPathObjectPtr pxVar11;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar12;
  Scope *this_01;
  Scope *this_02;
  size_t nrJA;
  RewardModelMapping *this_03;
  reference ppRVar13;
  mapped_type *pmVar14;
  EParse *pEVar15;
  long lVar16;
  char *this_04;
  ParserProbModelXML *pPVar17;
  key_type *__k;
  size_t i;
  Index IVar18;
  size_t k;
  ulong uVar19;
  ulong uVar20;
  elm_type eVar21;
  long lVar22;
  double reward;
  reference rVar23;
  allocator_type local_441;
  ulong local_440;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  Index jaI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t1_deps;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_AsAll;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  factor_names;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ptr_values;
  Scope O;
  Scope Y;
  Scope A;
  Scope X;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  string sf_descr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t0_deps;
  vector<unsigned_int,_std::allocator<unsigned_int>_> AsAll;
  Scope jaScope;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  vector<bool,_std::allocator<bool>_> factor_times;
  string utility_var_name;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  string ag_descr;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_d0;
  
  FactoredDecPOMDPDiscrete::InitializeInstantiationInformation(this->_m_fDecPOMDP);
  pxVar8 = GetNodesMatchingExpression
                     (this,(xmlChar *)
                           "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'utility\']",
                      (xmlNodePtr)0x0);
  if (pxVar8 == (xmlXPathObjectPtr)0x0) {
    pEVar15 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar15,"No reward potentials found in the model.");
  }
  else {
    pxVar1 = pxVar8->nodesetval;
    __x = &this->_m_ASizes;
    lVar16 = 0;
    while( true ) {
      if (pxVar1->nodeNr <= lVar16) {
        xmlXPathFreeObject(pxVar8);
        return;
      }
      this_04 = "UtilityVariable";
      pxVar9 = GetNodesMatchingExpression(this,(xmlChar *)"UtilityVariable",pxVar1->nodeTab[lVar16])
      ;
      if (pxVar9 == (xmlXPathObjectPtr)0x0) break;
      GetVariableName_abi_cxx11_
                (&utility_var_name,(ParserProbModelXML *)this_04,*pxVar9->nodesetval->nodeTab);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff80,(string *)&utility_var_name);
      pVar10 = GetParsedElement(this,(string *)&stack0xffffffffffffff80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      if (pVar10.first != REWARD) {
        pEVar15 = (EParse *)__cxa_allocate_exception(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t0_deps
                       ,"Found a reward table defined over non-reward variable \"",&utility_var_name
                      );
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t0_deps
                       ,"\".");
        EParse::EParse(pEVar15,&local_f0);
        __cxa_throw(pEVar15,&EParse::typeinfo,E::~E);
      }
      pPVar17 = (ParserProbModelXML *)0x52b590;
      pxVar11 = GetNodesMatchingExpression(this,"Variables/Variable",pxVar1->nodeTab[lVar16]);
      pxVar2 = pxVar11->nodesetval;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      uVar20 = (ulong)pVar10 >> 0x20;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar6 = 1;
      uVar19 = (ulong)(uint)pxVar2->nodeNr;
      while (0 < (int)uVar19) {
        node = pxVar2->nodeTab[uVar19 - 1];
        local_440 = uVar19;
        GetVariableName_abi_cxx11_((value_type *)&t0_deps,pPVar17,node);
        pPVar17 = (ParserProbModelXML *)&stack0xffffffffffffff60;
        std::__cxx11::string::string((string *)pPVar17,(string *)&t0_deps);
        pVar12 = GetParsedElement(this,(string *)pPVar17);
        uVar19 = (ulong)pVar12 >> 0x20;
        std::__cxx11::string::~string((string *)pPVar17);
        eVar21 = pVar12.first;
        IVar18 = pVar12.second;
        if (eVar21 == STATE) {
          iVar5 = GetVariableTimeslice(pPVar17,node);
          sf_descr._M_dataplus._M_p =
               (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                               super_MultiAgentDecisionProcessDiscreteFactoredStates
                                               ).super_MultiAgentDecisionProcess + 0xc0))
                                  (this->_m_fDecPOMDP,uVar19);
          if (iVar5 == 0) {
            Scope::Insert(&X,IVar18);
            t1_deps._M_t._M_impl._0_8_ = &Xs;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&ptr_values,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
          }
          else {
            Scope::Insert(&Y,IVar18);
            t1_deps._M_t._M_impl._0_8_ = &Ys;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&ptr_values,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back(&factor_times,iVar5 != 0);
        }
        else {
          if (eVar21 == ACTION) {
            if (this->_m_asynchronousModel == false) {
              sf_descr._M_dataplus._M_p =
                   (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                                                                      
                                                  super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                  ).super_MultiAgentDecisionProcess + 0x108))
                                      (this->_m_fDecPOMDP,uVar19);
            }
            else {
              sf_descr._M_dataplus._M_p =
                   (pointer)(__x->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                            ._M_impl.super__Vector_impl_data._M_start[uVar19];
            }
            Scope::Insert(&A,IVar18);
            t1_deps._M_t._M_impl._0_8_ = &As;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&ptr_values,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
            bVar4 = false;
          }
          else {
            if (eVar21 != OBSERVATION) {
              pEVar15 = (EParse *)__cxa_allocate_exception(0x28);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &t1_deps,"Reward \"",&utility_var_name);
              std::operator+(&local_110,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &t1_deps,"\" depends on unrecognized factors.");
              EParse::EParse(pEVar15,&local_110);
              __cxa_throw(pEVar15,&EParse::typeinfo,E::~E);
            }
            if (this->_m_asynchronousModel != false) {
              uVar19 = 0;
            }
            sf_descr._M_dataplus._M_p =
                 (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                 super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                 ).super_MultiAgentDecisionProcess + 0x168))
                                    (this->_m_fDecPOMDP,uVar19);
            Scope::Insert(&O,IVar18);
            t1_deps._M_t._M_impl._0_8_ = &Os;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&ptr_values,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
            bVar4 = true;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back(&factor_times,bVar4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&factor_names,(value_type *)&t0_deps);
        pPVar17 = (ParserProbModelXML *)&sf_descr;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&factor_sizes,(value_type_conflict2 *)pPVar17);
        uVar6 = uVar6 * (int)sf_descr._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&t0_deps);
        uVar19 = local_440 - 1;
      }
      t0_deps._M_t._M_impl._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&factor_values,
                 (long)factor_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)factor_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (value_type_conflict1 *)&t0_deps,(allocator_type *)&t1_deps);
      this_01 = (Scope *)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                ).super_MultiAgentDecisionProcess + 0x280))
                                   (this->_m_fDecPOMDP,uVar20);
      this_02 = (Scope *)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                ).super_MultiAgentDecisionProcess + 0x288))
                                   (this->_m_fDecPOMDP,uVar20);
      Scope::SoftPrint_abi_cxx11_(&sf_descr,this_01);
      Scope::SoftPrint_abi_cxx11_(&ag_descr,this_02);
      IVar18 = pVar10.second;
      local_440 = FactoredDecPOMDPDiscrete::GetNrXIs(this->_m_fDecPOMDP,IVar18);
      nrJA = FactoredDecPOMDPDiscrete::GetNrAIs(this->_m_fDecPOMDP,IVar18);
      this_03 = (RewardModelMapping *)operator_new(0x80);
      RewardModelMapping::RewardModelMapping(this_03,local_440,nrJA,&sf_descr,&ag_descr);
      ppRVar13 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at
                           (&this->_m_fDecPOMDP->_m_LRFs,uVar20);
      *ppRVar13 = (value_type)this_03;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t0_deps._M_t._M_impl.super__Rb_tree_header._M_header;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t1_deps._M_t._M_impl.super__Rb_tree_header._M_header;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar7 = 0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (local_440 = CONCAT44(local_440._4_4_,uVar7), uVar7 != (~((int)uVar6 >> 0x1f) & uVar6))
      {
        lVar22 = 0;
        for (uVar20 = 0;
            uVar20 < (ulong)((long)factor_names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)factor_names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar20 = uVar20 + 1) {
          rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[](&factor_times,uVar20);
          uVar7 = factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar20];
          uVar3 = factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar20];
          __k = (key_type *)
                ((long)&((factor_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar22);
          if ((*rVar23._M_p & rVar23._M_mask) == 0) {
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      ::operator[](&t0_deps,__k);
          }
          else {
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                      ::operator[](&t1_deps,__k);
          }
          pmVar14->first = uVar7;
          pmVar14->second = (uint)uVar3;
          lVar22 = lVar22 + 0x20;
        }
        std::__cxx11::string::string((string *)&local_130,(string *)&utility_var_name);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree(&local_d0,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)&t0_deps);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)&stack0xffffffffffffffa0,&t1_deps._M_t);
        reward = GetPotential(this,&local_130,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)&local_d0,
                              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)&stack0xffffffffffffffa0,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                     *)&stack0xffffffffffffffa0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
        ::~_Rb_tree(&local_d0);
        std::__cxx11::string::~string((string *)&local_130);
        lVar22 = 0;
        for (uVar20 = 0;
            uVar20 < (ulong)((long)ptr_values.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ptr_values.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar20 = uVar20 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                      ((long)ptr_values.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar22 * 2),
                     (value_type_conflict1 *)
                     ((long)factor_values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar22));
          lVar22 = lVar22 + 4;
        }
        if (this->_m_asynchronousModel == false) {
          FactoredDecPOMDPDiscrete::SetRewardForLRF
                    (this->_m_fDecPOMDP,IVar18,&X,&Xs,&A,&As,&Y,&Ys,&O,&Os,reward);
        }
        else {
          jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          Scope::Insert(&jaScope,0);
          if (As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            FactoredDecPOMDPDiscrete::SetRewardForLRF
                      (this->_m_fDecPOMDP,IVar18,&X,&Xs,
                       (Scope *)&AsAll.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&r_AsAll,&Y,&Ys,&O,&Os
                       ,reward);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&r_AsAll);
          }
          else {
            r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)r_AsAll.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                       (long)(this->_m_ASizes).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_m_ASizes).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3,
                       (value_type_conflict1 *)&r_AsAll,(allocator_type *)&local_168);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_AsAll,__x);
            for (lVar22 = 0;
                (long)A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2 != lVar22; lVar22 = lVar22 + 1)
            {
              uVar7 = A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar22];
              r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = 1;
              AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] =
                   As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
            }
            do {
              jaI = IndexTools::IndividualToJointIndices
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &AsAll.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x)
              ;
              this_00 = this->_m_fDecPOMDP;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,1,&jaI,
                         &local_441);
              FactoredDecPOMDPDiscrete::SetRewardForLRF
                        (this_00,IVar18,&X,&Xs,&jaScope,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,&Y,&Ys,&O
                         ,&Os,reward);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&local_168);
              bVar4 = IndexTools::Increment
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &AsAll.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                                 &r_AsAll);
            } while (!bVar4);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&jaScope);
        }
        if (Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        IndexTools::Increment(&factor_values,&factor_sizes);
        uVar7 = (int)local_440 + 1;
      }
      xmlXPathFreeObject(pxVar9);
      xmlXPathFreeObject(pxVar11);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&t1_deps._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)&t0_deps);
      std::__cxx11::string::~string((string *)&ag_descr);
      std::__cxx11::string::~string((string *)&sf_descr);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&factor_times.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&factor_names);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::~_Vector_base(&ptr_values.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&O);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&Y);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&A);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&X);
      std::__cxx11::string::~string((string *)&utility_var_name);
      lVar16 = lVar16 + 1;
    }
    pEVar15 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar15,"Found a reward table node with no codomain.");
  }
  __cxa_throw(pEVar15,&EParse::typeinfo,E::~E);
}

Assistant:

void ParserProbModelXML::ReadLRFs()
{
    _m_fDecPOMDP->InitializeInstantiationInformation();

    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Potentials/Potential[@role='utility']";
    xmlXPathObjectPtr reward_potentials = GetNodesMatchingExpression(xpath);

    if(reward_potentials == NULL){
        throw EParse("No reward potentials found in the model.");
    }

    xmlNodeSetPtr potentials_nodeset = reward_potentials->nodesetval;
    for(int i = 0; i < potentials_nodeset->nodeNr; i++)
    {
        xmlXPathObjectPtr utility_var_node = GetNodesMatchingExpression((xmlChar*) "UtilityVariable",potentials_nodeset->nodeTab[i]);
        if(utility_var_node == NULL)
            throw EParse("Found a reward table node with no codomain.");
            
        string utility_var_name = GetVariableName(utility_var_node->nodesetval->nodeTab[0]);

        std::pair<ParserProbModelXML::elm_type, Index> elm;
        elm = GetParsedElement(utility_var_name);
        if(elm.first != REWARD)
            throw EParse("Found a reward table defined over non-reward variable \"" + utility_var_name + "\".");
        Index LRFix = elm.second; //LRF index

        xmlXPathObjectPtr vars = GetNodesMatchingExpression((xmlChar*) "Variables/Variable",potentials_nodeset->nodeTab[i]);
        xmlNodeSetPtr var_nodeset = vars->nodesetval;

        Scope X, A, Y, O;
        vector<Index> Xs, As, Ys, Os;
        vector<vector<Index>* > ptr_values;
        vector<size_t> factor_sizes;
        vector<string> factor_names;
        vector<bool> factor_times;
        int nValues = 1;
        for(int j = var_nodeset->nodeNr-1; j >= 0; j--) //have to store everything bottom-up
        {
            size_t size;
            xmlNodePtr node = var_nodeset->nodeTab[j];
            string var_name = GetVariableName(node);
            elm = GetParsedElement(var_name);
            switch(elm.first)
            {
                case STATE:
                    {
                        int timeslice = GetVariableTimeslice(node);
                        size = _m_fDecPOMDP->GetNrValuesForFactor(elm.second);
                        if(timeslice == 0)
                        {
                            X.Insert(elm.second);
                            ptr_values.push_back(&Xs);
                            factor_times.push_back(0);
                        }
                        else
                        {
                            Y.Insert(elm.second);
                            ptr_values.push_back(&Ys);
                            factor_times.push_back(1);
                        }
                    }
                    break;
                case ACTION:
                    if(!_m_asynchronousModel){
                        size = _m_fDecPOMDP->GetNrActions(elm.second);
                    }else{
                        size = _m_ASizes[elm.second];
                    }
                    A.Insert(elm.second);
                    ptr_values.push_back(&As);
                    factor_times.push_back(0);
                    break;
                case OBSERVATION:
                    if(!_m_asynchronousModel)
                        size = _m_fDecPOMDP->GetNrObservations(elm.second);
                    else
                        size = _m_fDecPOMDP->GetNrObservations(0);
                    O.Insert(elm.second);
                    ptr_values.push_back(&Os);
                    factor_times.push_back(1);
                    break;
                default:
                    throw EParse("Reward \"" + utility_var_name + "\" depends on unrecognized factors.");
            }
            factor_names.push_back(var_name);
            factor_sizes.push_back(size);
            nValues *=size;
        }
        vector<Index> factor_values(factor_names.size(), 0);        

        const Scope& sfSC = _m_fDecPOMDP->GetStateFactorScopeForLRF(LRFix);
        const Scope& agSC = _m_fDecPOMDP->GetAgentScopeForLRF(LRFix);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        size_t nrXIs = _m_fDecPOMDP->GetNrXIs(LRFix);
        size_t nrAIs = _m_fDecPOMDP->GetNrAIs(LRFix);
        
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        _m_fDecPOMDP->SetRM(LRFix, RMe);

        map<string, pair<Index, Index> > t0_deps;
        map<string, pair<Index, Index> > t1_deps;
        for(int j = 0; j < nValues; j++)
        {
            for(size_t k = 0; k < factor_names.size(); k++)
            {
              if(factor_times[k] == 0)
                t0_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
              else
                t1_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
            }

            double r = GetPotential(utility_var_name, t0_deps, t1_deps, true);

            for(size_t k = 0; k < ptr_values.size(); k++)
            {
                ptr_values[k]->push_back(factor_values[k]);
            }

            if(!_m_asynchronousModel)
                _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, A, As, Y, Ys, O, Os, r);
            else{
                Scope jaScope;
                jaScope.Insert(0);
                
                if(As.size() > 0){
                    ///now we have to go over all joint actions which map to A, As...
                    vector<Index> AsAll(_m_ASizes.size(), 0);
                    vector<size_t> r_AsAll = _m_ASizes;
                    for(size_t i = 0; i < A.size(); i++){
                        r_AsAll[A[i]] = 1; ///this prevents Increment from going over the variables already in the scope.
                        AsAll[A[i]] = As[i];
                    }
                    do{
                       Index jaI = IndexTools::IndividualToJointIndices(AsAll,_m_ASizes);
                        _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, jaScope, vector<Index>(1,jaI), Y, Ys, O, Os, r);
                    }while(! IndexTools::Increment( AsAll, r_AsAll ));
                }
                else
                {
                    _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, Scope(), vector<Index>(), Y, Ys, O, Os, r);
                }
            }
                
            Xs.clear();
            As.clear();
            Ys.clear();
            Os.clear();
            if(DEBUG_PARSE)
            {
                cout << "X: " << X.SoftPrint() << "->";
                for(size_t k = 0; k < Xs.size(); k++)
                    cout << Xs[k] << " ";
                cout << endl << "Y: " << Y.SoftPrint() << "->";
                for(size_t k = 0; k < Ys.size(); k++)
                    cout << Ys[k] << " ";
                cout << endl << "A: " << A.SoftPrint() << "->";
                for(size_t k = 0; k < As.size(); k++)
                    cout << As[k] << " ";
                cout << endl << "O: " << O.SoftPrint() << "->";
                for(size_t k = 0; k < Os.size(); k++)
                    cout << Os[k] << " ";
                cout << endl;

                cout << "LRF " << LRFix << " has sf scope " << sf_descr << " and ag scope " << ag_descr << " and for indexes ";
                    for(size_t k = 0; k < factor_values.size(); k++)
                      cout << factor_values[k] << " ";
                    cout << "it has reward " << r << endl;
            }
            IndexTools::Increment(factor_values, factor_sizes);
        }

        xmlXPathFreeObject (utility_var_node);
        xmlXPathFreeObject (vars);
    }

    xmlXPathFreeObject (reward_potentials);
}